

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O3

CBlock * __thiscall
TestChain100Setup::CreateAndProcessBlock
          (CBlock *__return_storage_ptr__,TestChain100Setup *this,
          vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *txns,
          CScript *scriptPubKey,Chainstate *chainstate)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar1;
  long in_FS_OFFSET;
  shared_ptr<const_CBlock> shared_pblock;
  shared_ptr<const_CBlock> local_40;
  undefined1 local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (chainstate == (Chainstate *)0x0) {
    puVar1 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                       (&(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                        ,0x189,"CreateAndProcessBlock","m_node.chainman");
    chainstate = ChainstateManager::ActiveChainstate
                           ((puVar1->_M_t).
                            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                            .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  }
  CreateBlock(__return_storage_ptr__,this,txns,scriptPubKey,chainstate);
  local_40.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CBlock_const,std::allocator<CBlock>,CBlock&>
            (&local_40.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CBlock **)&local_40,(allocator<CBlock> *)&local_29,__return_storage_ptr__);
  puVar1 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                      ,0x18e,"CreateAndProcessBlock","m_node.chainman");
  ChainstateManager::ProcessNewBlock
            ((puVar1->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&local_40,true,true,
             (bool *)0x0);
  if (local_40.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CBlock TestChain100Setup::CreateAndProcessBlock(
    const std::vector<CMutableTransaction>& txns,
    const CScript& scriptPubKey,
    Chainstate* chainstate)
{
    if (!chainstate) {
        chainstate = &Assert(m_node.chainman)->ActiveChainstate();
    }

    CBlock block = this->CreateBlock(txns, scriptPubKey, *chainstate);
    std::shared_ptr<const CBlock> shared_pblock = std::make_shared<const CBlock>(block);
    Assert(m_node.chainman)->ProcessNewBlock(shared_pblock, true, true, nullptr);

    return block;
}